

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::f_formatter<spdlog::details::scoped_padder>::format
          (f_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  uint32_or_64_or_128_t<unsigned_long> n;
  ulong value;
  long lVar4;
  format_decimal_result<char_*> fVar5;
  scoped_padder p;
  scoped_padder sStack_68;
  char local_40 [21];
  char acStack_2b [3];
  char *local_28;
  
  lVar4 = (msg->time).__d.__r;
  value = (lVar4 / 1000000000) * -1000000 + lVar4 / 1000;
  scoped_padder::scoped_padder(&sStack_68,6,&(this->super_flag_formatter).padinfo_,dest);
  lVar4 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar2 = (uint)(byte)fmt::v10::detail::do_count_digits(unsigned_long)::bsr2log10[lVar4] -
          (uint)(value < *(ulong *)(fmt::v10::detail::do_count_digits(unsigned_long)::
                                    zero_or_powers_of_10 +
                                   (ulong)(byte)fmt::v10::detail::do_count_digits(unsigned_long)::
                                                bsr2log10[lVar4] * 8));
  if (uVar2 < 6) {
    iVar3 = 6 - uVar2;
    do {
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar1 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar1 + 1;
      (dest->super_buffer<char>).ptr_[sVar1] = '0';
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  fVar5 = fmt::v10::detail::format_decimal<char,unsigned_long>(local_40,value,0x15);
  local_28 = fVar5.begin;
  lVar4 = (long)local_40 - (long)local_28;
  if (-0x16 < lVar4) {
    fmt::v10::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_28,local_28 + lVar4 + 0x15);
    scoped_padder::~scoped_padder(&sStack_68);
    return;
  }
  fmt::v10::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
             ,0x189,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }